

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O3

void grd_flupgrad(grd_st_t *grd_st,seq_t *seq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  mdl_t *pmVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  uint64_t uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  anon_union_8_2_94730072 old;
  
  uVar6 = seq->len;
  uVar20 = (ulong)uVar6;
  if (uVar20 != 0) {
    pmVar8 = grd_st->mdl;
    pdVar9 = grd_st->g;
    uVar7 = pmVar8->nlbl;
    uVar21 = (ulong)uVar7;
    pdVar10 = grd_st->psi;
    pdVar11 = grd_st->alpha;
    pdVar12 = grd_st->beta;
    pdVar13 = grd_st->unorm;
    pdVar14 = grd_st->bnorm;
    uVar22 = 0;
    do {
      if (uVar21 != 0) {
        uVar16 = (ulong)*(uint *)&seq[uVar22 * 2 + 1].field_0x4;
        uVar23 = 0;
        do {
          if ((int)uVar16 == 0) {
            uVar16 = 0;
          }
          else {
            dVar1 = pdVar11[uVar22 * uVar21 + uVar23];
            dVar2 = pdVar12[uVar22 * uVar21 + uVar23];
            dVar3 = pdVar13[uVar22];
            uVar18 = 0;
            do {
              uVar15 = pmVar8->uoff[*(long *)(*(long *)(seq + uVar22 * 2 + 2) + uVar18 * 8)];
              do {
                dVar4 = pdVar9[uVar23 + uVar15];
                LOCK();
                bVar24 = dVar4 == pdVar9[uVar23 + uVar15];
                if (bVar24) {
                  pdVar9[uVar23 + uVar15] = dVar4 + dVar1 * dVar2 * dVar3;
                }
                UNLOCK();
              } while (!bVar24);
              uVar18 = uVar18 + 1;
              uVar16 = (ulong)*(uint *)&seq[uVar22 * 2 + 1].field_0x4;
            } while (uVar18 < uVar16);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar21);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar20);
    if (uVar6 != 1) {
      uVar22 = 1;
      do {
        if (uVar7 != 0) {
          uVar16 = (ulong)*(uint *)&seq[uVar22 * 2 + 1].raw;
          uVar18 = 0;
          uVar23 = 0;
          do {
            uVar17 = 0;
            uVar19 = uVar16;
            do {
              if ((int)uVar19 == 0) {
                uVar19 = 0;
              }
              else {
                dVar1 = pdVar11[(uVar22 - 1) * uVar21 + uVar18];
                dVar2 = pdVar12[uVar22 * uVar21 + uVar17];
                dVar3 = pdVar10[uVar21 * uVar21 * uVar22 + uVar18 * uVar21 + uVar17];
                dVar4 = pdVar14[uVar22];
                uVar19 = 0;
                do {
                  uVar15 = pmVar8->boff[seq[uVar22 * 2 + 2].raw[uVar19]];
                  do {
                    dVar5 = pdVar9[uVar23 + uVar15];
                    LOCK();
                    bVar24 = dVar5 == pdVar9[uVar23 + uVar15];
                    if (bVar24) {
                      pdVar9[uVar23 + uVar15] = dVar5 + dVar1 * dVar2 * dVar3 * dVar4;
                    }
                    UNLOCK();
                  } while (!bVar24);
                  uVar19 = uVar19 + 1;
                  uVar16 = (ulong)*(uint *)&seq[uVar22 * 2 + 1].raw;
                } while (uVar19 < uVar16);
                uVar19 = (ulong)*(uint *)&seq[uVar22 * 2 + 1].raw;
              }
              uVar17 = uVar17 + 1;
              uVar23 = (ulong)((int)uVar23 + 1);
            } while (uVar17 != uVar21);
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar21);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar20);
    }
  }
  return;
}

Assistant:

void grd_flupgrad(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	const double (*psi  )[T][Y][Y] = (void *)grd_st->psi;
	const double (*alpha)[T][Y]    = (void *)grd_st->alpha;
	const double (*beta )[T][Y]    = (void *)grd_st->beta;
	const double  *unorm           =         grd_st->unorm;
	const double  *bnorm           =         grd_st->bnorm;
	double *g = grd_st->g;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double e = (*alpha)[t][y] * (*beta)[t][y] * unorm[t];
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				atm_inc(g + mdl->uoff[o] + y, e);
			}
		}
	}
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
			for (uint32_t y = 0; y < Y; y++, d++) {
				double e = (*alpha)[t - 1][yp] * (*beta)[t][y]
				         * (*psi)[t][yp][y] * bnorm[t];
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					atm_inc(g + mdl->boff[o] + d, e);
				}
			}
		}
	}
}